

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O0

int32_t parse_sort_bfr(Btor2Parser *bfr,Btor2Line *l)

{
  int iVar1;
  int32_t iVar2;
  undefined8 *in_RSI;
  Btor2Parser *in_RDI;
  Btor2Sort s;
  Btor2Sort tmp;
  char *tag;
  Btor2Parser *in_stack_ffffffffffffff88;
  uint32_t *in_stack_ffffffffffffff90;
  Btor2Parser *bfr_00;
  Btor2Parser *in_stack_ffffffffffffff98;
  undefined8 local_48;
  undefined4 local_40;
  char *local_38;
  Btor2Parser *local_30;
  Btor2Parser *local_28;
  char *local_20;
  undefined8 *local_18;
  Btor2Parser *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = parse_tag(in_stack_ffffffffffffff88);
  if (local_20 == (char *)0x0) {
    return 0;
  }
  iVar1 = strcmp(local_20,"bitvec");
  if (iVar1 == 0) {
    local_40 = 1;
    local_38 = "bitvec";
    iVar2 = parse_pos_number_bfr(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    if (iVar2 == 0) {
      return 0;
    }
    if ((int)local_30 == 0) {
      iVar2 = perr_bfr(local_10,"bit width must be greater than 0");
      return iVar2;
    }
  }
  else {
    iVar1 = strcmp(local_20,"array");
    if (iVar1 != 0) {
      iVar2 = perr_bfr(local_10,"invalid sort tag");
      return iVar2;
    }
    local_40 = 0;
    local_38 = "array";
    bfr_00 = (Btor2Parser *)0x0;
    iVar2 = parse_sort_id_bfr(in_stack_ffffffffffffff98,(Btor2Sort *)0x0);
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = getc_bfr(bfr_00);
    if (iVar2 != 0x20) {
      iVar2 = perr_bfr(local_10,"expected space");
      return iVar2;
    }
    local_30 = bfr_00;
    iVar2 = parse_sort_id_bfr(in_stack_ffffffffffffff98,(Btor2Sort *)bfr_00);
    local_28 = bfr_00;
    if (iVar2 == 0) {
      return 0;
    }
  }
  local_48 = *local_18;
  memcpy(local_18 + 4,&local_48,0x28);
  return 1;
}

Assistant:

static int32_t
parse_sort_bfr (Btor2Parser *bfr, Btor2Line *l)
{
  const char *tag;
  Btor2Sort tmp, s;
  tag = parse_tag (bfr);
  if (!tag) return 0;
  if (!strcmp (tag, "bitvec"))
  {
    tmp.tag  = BTOR2_TAG_SORT_bitvec;
    tmp.name = "bitvec";
    if (!parse_pos_number_bfr (bfr, &tmp.bitvec.width)) return 0;
    if (tmp.bitvec.width == 0)
      return perr_bfr (bfr, "bit width must be greater than 0");
  }
  else if (!strcmp (tag, "array"))
  {
    tmp.tag  = BTOR2_TAG_SORT_array;
    tmp.name = "array";
    s.id = 0;   /* get rid of false positive compiler warning */
    if (!parse_sort_id_bfr (bfr, &s)) return 0;
    if (getc_bfr (bfr) != ' ') return perr_bfr (bfr, "expected space");
    tmp.array.index = s.id;
    if (!parse_sort_id_bfr (bfr, &s)) return 0;
    tmp.array.element = s.id;
  }
  else
  {
    return perr_bfr (bfr, "invalid sort tag");
  }
  tmp.id  = l->id;
  l->sort = tmp;
  return 1;
}